

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

char * __thiscall tinyxml2::StrPair::ParseName(StrPair *this,char *p)

{
  uchar *puVar1;
  bool bVar2;
  uchar *puVar3;
  
  if (((p == (char *)0x0) || (*p == '\0')) || (bVar2 = XMLUtil::IsNameStartChar(*p), !bVar2)) {
    return (char *)0x0;
  }
  puVar1 = (uchar *)(p + 1);
  do {
    puVar3 = puVar1;
    if (*puVar3 == '\0') break;
    bVar2 = XMLUtil::IsNameChar(*puVar3);
    puVar1 = puVar3 + 1;
  } while (bVar2);
  Reset(this);
  this->_start = p;
  this->_end = (char *)puVar3;
  this->_flags = 0x100;
  return (char *)puVar3;
}

Assistant:

char* StrPair::ParseName( char* p )
{
    if ( !p || !(*p) ) {
        return 0;
    }
    if ( !XMLUtil::IsNameStartChar( *p ) ) {
        return 0;
    }

    char* const start = p;
    ++p;
    while ( *p && XMLUtil::IsNameChar( *p ) ) {
        ++p;
    }

    Set( start, p, 0 );
    return p;
}